

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O2

int linux_eventfd_raise(eventfd *efd)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  uint64_t counter;
  
  counter = 1;
  sVar2 = write(efd->ef_id,&counter,8);
  uVar1 = 0;
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 0;
    if (*piVar3 != 0xb) {
      uVar1 = -(uint)(*piVar3 != 4) | 0xfffffffc;
    }
  }
  return uVar1;
}

Assistant:

static int
linux_eventfd_raise(struct eventfd *efd)
{
    uint64_t counter;
    int rv = 0;

    dbg_printf("eventfd=%i - raising event level", efd->ef_id);
    counter = 1;
    if (write(efd->ef_id, &counter, sizeof(counter)) < 0) {
        switch (errno) {
        case EAGAIN:
            /* Not considered an error */
            break;

        case EINTR:
            rv = -EINTR;
            break;

        default:
            dbg_printf("write(2): %s", strerror(errno));
            rv = -1;
        }
    }
    return (rv);
}